

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,ClassDecl *decl)

{
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *this_00;
  bool bVar1;
  element_type *peVar2;
  DuplicatedSymbols *this_01;
  mapped_type *pos;
  SymTbl *this_02;
  NodeID local_80 [3];
  enable_shared_from_this<mocker::ast::ASTNode> local_68;
  shared_ptr<mocker::ast::ASTNode> local_58;
  shared_ptr<mocker::ast::Declaration> local_48;
  ScopeID local_38;
  undefined1 local_19;
  ClassDecl *pCStack_18;
  bool res;
  ClassDecl *decl_local;
  Collect *this_local;
  
  this_02 = &this->ctx->syms;
  pCStack_18 = decl;
  decl_local = (ClassDecl *)this;
  SymTbl::global(&local_38,this_02);
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&pCStack_18->identifier);
  std::enable_shared_from_this<mocker::ast::ASTNode>::shared_from_this(&local_68);
  std::static_pointer_cast<mocker::ast::ClassDecl,mocker::ast::ASTNode>(&local_58);
  std::shared_ptr<mocker::ast::Declaration>::shared_ptr<mocker::ast::ClassDecl,void>
            (&local_48,(shared_ptr<mocker::ast::ClassDecl> *)&local_58);
  bVar1 = SymTbl::addSymbol(this_02,&local_38,&peVar2->val,&local_48);
  std::shared_ptr<mocker::ast::Declaration>::~shared_ptr(&local_48);
  std::shared_ptr<mocker::ast::ClassDecl>::~shared_ptr
            ((shared_ptr<mocker::ast::ClassDecl> *)&local_58);
  std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr((shared_ptr<mocker::ast::ASTNode> *)&local_68);
  ScopeID::~ScopeID(&local_38);
  if (!bVar1) {
    local_19 = bVar1;
    this_01 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
    this_00 = this->pos;
    local_80[0] = ast::ASTNode::getID((ASTNode *)pCStack_18);
    pos = std::
          unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
          ::at(this_00,local_80);
    peVar2 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pCStack_18->identifier);
    DuplicatedSymbols::DuplicatedSymbols(this_01,pos,&peVar2->val);
    __cxa_throw(this_01,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
  }
  return;
}

Assistant:

void operator()(ast::ClassDecl &decl) const override {
      auto res = ctx.syms.addSymbol(
          ctx.syms.global(), decl.identifier->val,
          std::static_pointer_cast<ast::ClassDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), decl.identifier->val);
    }